

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O2

PackedColor Imath_3_2::rgb2packed<unsigned_char>(Vec3<unsigned_char> *c)

{
  ushort uVar1;
  PackedColor PVar2;
  undefined1 auVar3 [16];
  Vec3<float> local_10;
  
  local_10.z = (float)c->z / 255.0;
  uVar1._0_1_ = c->x;
  uVar1._1_1_ = c->y;
  auVar3._0_4_ = (float)(uVar1 & 0xff);
  auVar3._4_4_ = (float)(byte)uVar1._1_1_;
  auVar3._8_8_ = 0;
  auVar3 = divps(auVar3,_DAT_00157a90);
  local_10._0_8_ = auVar3._0_8_;
  PVar2 = rgb2packed<float>(&local_10);
  return PVar2;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 PackedColor
rgb2packed (const Vec3<T>& c) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        float x = c.x / float (std::numeric_limits<T>::max ());
        float y = c.y / float (std::numeric_limits<T>::max ());
        float z = c.z / float (std::numeric_limits<T>::max ());
        return rgb2packed (V3f (x, y, z));
    }
    else
    {
        // clang-format off
	return (  (PackedColor) (c.x * 255)		|
		(((PackedColor) (c.y * 255)) << 8)	|
		(((PackedColor) (c.z * 255)) << 16)	| 0xFF000000 );
        // clang-format on
    }
}